

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCounters.h
# Opt level: O3

uint32 __thiscall
Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Increase
          (CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this,
          CounterFields typeEnum,FunctionBody *host)

{
  Type TVar1;
  Fields FVar2;
  ushort uVar3;
  uint32 uVar4;
  Fields *pFVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  undefined7 in_register_00000031;
  ulong uVar9;
  
  uVar9 = CONCAT71(in_register_00000031,typeEnum) & 0xffffffff;
  while( true ) {
    while (TVar1 = this->fieldSize, TVar1 == '\x01') {
      pFVar5 = (this->fields).ptr;
      FVar2 = pFVar5[uVar9];
      if (FVar2 != (Fields)0xff) {
        pFVar5[uVar9] = (Fields)((char)FVar2 + 1);
        return (uint)(byte)FVar2;
      }
      AllocCounters<unsigned_short>(this,host);
      this = &host->counters;
    }
    if (TVar1 != '\x02') {
      if (TVar1 != '\x04') {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                    ,0x8f,"(fieldSize == 4)","fieldSize == 4");
        if (!bVar7) {
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar8 = 0;
      }
      pFVar5 = (this->fields).ptr;
      uVar4 = *(uint32 *)(pFVar5 + uVar9 * 4);
      *(uint32 *)(pFVar5 + uVar9 * 4) = uVar4 + 1;
      return uVar4;
    }
    pFVar5 = (this->fields).ptr;
    uVar3 = *(ushort *)(pFVar5 + uVar9 * 2);
    if (uVar3 != 0xffff) break;
    AllocCounters<unsigned_int>(this,host);
    this = &host->counters;
  }
  *(ushort *)(pFVar5 + uVar9 * 2) = uVar3 + 1;
  return (uint)uVar3;
}

Assistant:

uint32 Increase(CountT typeEnum, T* host)
        {
            uint8 type = static_cast<uint8>(typeEnum);
            if (fieldSize == 1)
            {
                if (this->fields->u8Fields[type] < UINT8_MAX)
                {
                    return this->fields->u8Fields[type]++;
                }
                else
                {
                    AllocCounters<uint16>(host);
                    return host->counters.Increase(typeEnum, host);
                }
            }

            if (fieldSize == 2)
            {
                if (this->fields->u16Fields[type] < UINT16_MAX)
                {
                    return this->fields->u16Fields[type]++;
                }
                else
                {
                    AllocCounters<uint32>(host);
                    return host->counters.Increase(typeEnum, host);
                }
            }

            Assert(fieldSize == 4);
            return this->fields->u32Fields[type]++;
        }